

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall
cmComputeLinkDepends::FollowSharedDeps
          (cmComputeLinkDepends *this,int depender_index,cmLinkInterface *iface,
          bool follow_interface)

{
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar1;
  bool follow_interface_local;
  cmLinkInterface *iface_local;
  cmComputeLinkDepends *pcStack_10;
  int depender_index_local;
  cmComputeLinkDepends *this_local;
  
  iface_local._4_4_ = depender_index;
  pcStack_10 = this;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    (&this->SharedDepFollowed,(value_type_conflict3 *)((long)&iface_local + 4));
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if (follow_interface) {
      QueueSharedDependencies
                (this,iface_local._4_4_,(vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
    }
    QueueSharedDependencies(this,iface_local._4_4_,&iface->SharedDeps);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::FollowSharedDeps(int depender_index,
                                            cmLinkInterface const* iface,
                                            bool follow_interface)
{
  // Follow dependencies if we have not followed them already.
  if (this->SharedDepFollowed.insert(depender_index).second) {
    if (follow_interface) {
      this->QueueSharedDependencies(depender_index, iface->Libraries);
    }
    this->QueueSharedDependencies(depender_index, iface->SharedDeps);
  }
}